

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signingprovider.cpp
# Opt level: O0

set<CScriptID,_std::less<CScriptID>,_std::allocator<CScriptID>_> * __thiscall
FillableSigningProvider::GetCScripts(FillableSigningProvider *this)

{
  long lVar1;
  bool bVar2;
  char *in_RSI;
  set<CScriptID,_std::less<CScriptID>,_std::allocator<CScriptID>_> *in_RDI;
  long in_FS_OFFSET;
  pair<std::_Rb_tree_const_iterator<CScriptID>,_bool> pVar3;
  pair<const_CScriptID,_CScript> *mi;
  ScriptMap *__range1;
  set<CScriptID,_std::less<CScriptID>,_std::allocator<CScriptID>_> *set_script;
  const_iterator __end1;
  const_iterator __begin1;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock6;
  set<CScriptID,_std::less<CScriptID>,_std::allocator<CScriptID>_> *in_stack_ffffffffffffff58;
  map<CScriptID,_CScript,_std::less<CScriptID>,_std::allocator<std::pair<const_CScriptID,_CScript>_>_>
  *in_stack_ffffffffffffff60;
  undefined7 in_stack_ffffffffffffff68;
  undefined1 in_stack_ffffffffffffff6f;
  set<CScriptID,_std::less<CScriptID>,_std::allocator<CScriptID>_> *pszFile;
  AnnotatedMixin<std::recursive_mutex> *in_stack_ffffffffffffff90;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *in_stack_ffffffffffffff98;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pszFile = in_RDI;
  MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
            ((AnnotatedMixin<std::recursive_mutex> *)in_stack_ffffffffffffff58);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            (in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,in_RSI,(char *)pszFile,
             (int)((ulong)in_RDI >> 0x20),SUB81((ulong)in_RDI >> 0x18,0));
  std::set<CScriptID,_std::less<CScriptID>,_std::allocator<CScriptID>_>::set
            (in_stack_ffffffffffffff58);
  std::
  map<CScriptID,_CScript,_std::less<CScriptID>,_std::allocator<std::pair<const_CScriptID,_CScript>_>_>
  ::begin(in_stack_ffffffffffffff60);
  std::
  map<CScriptID,_CScript,_std::less<CScriptID>,_std::allocator<std::pair<const_CScriptID,_CScript>_>_>
  ::end(in_stack_ffffffffffffff60);
  while (bVar2 = std::operator==((_Self *)CONCAT17(in_stack_ffffffffffffff6f,
                                                   in_stack_ffffffffffffff68),
                                 (_Self *)in_stack_ffffffffffffff60), ((bVar2 ^ 0xffU) & 1) != 0) {
    std::_Rb_tree_const_iterator<std::pair<const_CScriptID,_CScript>_>::operator*
              ((_Rb_tree_const_iterator<std::pair<const_CScriptID,_CScript>_> *)
               in_stack_ffffffffffffff58);
    pVar3 = std::set<CScriptID,_std::less<CScriptID>,_std::allocator<CScriptID>_>::insert
                      ((set<CScriptID,_std::less<CScriptID>,_std::allocator<CScriptID>_> *)
                       CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68),
                       (value_type *)in_stack_ffffffffffffff60);
    in_stack_ffffffffffffff6f = pVar3.second;
    std::_Rb_tree_const_iterator<std::pair<const_CScriptID,_CScript>_>::operator++
              ((_Rb_tree_const_iterator<std::pair<const_CScriptID,_CScript>_> *)
               in_stack_ffffffffffffff58);
  }
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::~UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)in_stack_ffffffffffffff58);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return in_RDI;
}

Assistant:

std::set<CScriptID> FillableSigningProvider::GetCScripts() const
{
    LOCK(cs_KeyStore);
    std::set<CScriptID> set_script;
    for (const auto& mi : mapScripts) {
        set_script.insert(mi.first);
    }
    return set_script;
}